

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  uint uVar2;
  Texture2D *tex2D;
  TextureBinding *extraout_RAX;
  long lVar3;
  char **ppcVar4;
  iterator iVar5;
  byte bVar6;
  int numTextures;
  TextureBinding local_b0;
  Sampler local_68;
  iterator __position;
  
  bVar6 = 0;
  uVar2 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  __position._M_current = (TextureBinding *)(ulong)uVar2;
  if ((this->m_flags & 1) != 0) {
    local_b0._0_8_ = "data/brick.png";
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,1,(char **)&local_b0);
    this->m_brickTexture = tex2D;
    local_68.wrapS = CLAMP_TO_EDGE;
    local_68.wrapT = CLAMP_TO_EDGE;
    local_68.wrapR = CLAMP_TO_EDGE;
    local_68.minFilter = LINEAR;
    local_68.magFilter = LINEAR;
    local_68.lodThreshold = 0.0;
    local_68.normalizedCoords = true;
    local_68.depthStencilMode = MODE_DEPTH;
    local_68.compare = COMPAREMODE_NONE;
    local_68.compareChannel = 0;
    local_68.borderColor.v.uData[0]._0_1_ = 0;
    local_68.borderColor.v._1_7_ = 0;
    local_68.borderColor.v.uData[2]._0_1_ = 0;
    local_68._45_8_ = 0;
    deqp::gls::TextureBinding::TextureBinding(&local_b0,tex2D,&local_68);
    __position._M_current =
         (this->super_ShaderRenderCase).m_textures.
         super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_ShaderRenderCase).m_textures.
        super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
      _M_realloc_insert<deqp::gls::TextureBinding>
                (&(this->super_ShaderRenderCase).m_textures,__position,&local_b0);
      __position._M_current = extraout_RAX;
    }
    else {
      ppcVar4 = (char **)&local_b0;
      iVar5._M_current = __position._M_current;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(char **)iVar5._M_current = *ppcVar4;
        ppcVar4 = ppcVar4 + (ulong)bVar6 * -2 + 1;
        iVar5._M_current = iVar5._M_current + (ulong)bVar6 * -0x10 + 8;
      }
      ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
                 super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return (int)__position._M_current;
}

Assistant:

void ShaderStructCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		if ((m_flags && FLAG_USES_TEXTURES) && m_isVertexCase)
		{
			int numTextures = 0;
			m_renderCtx.getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numTextures);
			if (numTextures == 0)
				throw tcu::NotSupportedError("Vertex shader texture access not supported");
		}

		if (m_flags & FLAG_REQUIRES_DYNAMIC_INDEXING)
			throw tcu::NotSupportedError("Dynamic indexing not supported");

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
}